

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O3

void __thiscall
cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb(cbtPolyhedralConvexAabbCachingShape *this)

{
  float fVar1;
  cbtScalar cVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  this->m_isLocalAabbValid = true;
  if (recalcLocalAabb()::_directions == '\0') {
    recalcLocalAabb();
  }
  lVar3 = 6;
  uStack_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0x13])
            (this,recalcLocalAabb::_directions,&uStack_78);
  fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_collisionMargin;
  auVar6._4_4_ = fVar1;
  auVar6._0_4_ = fVar1;
  auVar6._8_4_ = fVar1;
  auVar6._12_4_ = fVar1;
  auVar4 = vgatherdps_avx512vl(*(undefined4 *)((long)&uStack_78 + lVar3));
  cVar2 = (this->m_localAabbMax).m_floats[3];
  (this->m_localAabbMax).m_floats[0] = auVar4._0_4_ + fVar1;
  (this->m_localAabbMax).m_floats[1] = auVar4._4_4_ + fVar1;
  (this->m_localAabbMax).m_floats[2] = auVar4._8_4_ + fVar1;
  (this->m_localAabbMax).m_floats[3] = cVar2;
  auVar4 = vgatherdps_avx512vl(*(undefined4 *)((long)&uStack_78 + (long)this));
  auVar4._12_4_ = 0;
  auVar4 = vsubps_avx(auVar4,auVar6);
  auVar5._0_12_ = auVar4._0_12_;
  auVar5._12_4_ = (this->m_localAabbMin).m_floats[3];
  *(undefined1 (*) [16])(this->m_localAabbMin).m_floats = auVar5;
  return;
}

Assistant:

void cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb()
{
	m_isLocalAabbValid = true;

#if 1
	static const cbtVector3 _directions[] =
		{
			cbtVector3(1., 0., 0.),
			cbtVector3(0., 1., 0.),
			cbtVector3(0., 0., 1.),
			cbtVector3(-1., 0., 0.),
			cbtVector3(0., -1., 0.),
			cbtVector3(0., 0., -1.)};

	cbtVector3 _supporting[] =
		{
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.)};

	batchedUnitVectorGetSupportingVertexWithoutMargin(_directions, _supporting, 6);

	for (int i = 0; i < 3; ++i)
	{
		m_localAabbMax[i] = _supporting[i][i] + m_collisionMargin;
		m_localAabbMin[i] = _supporting[i + 3][i] - m_collisionMargin;
	}

#else

	for (int i = 0; i < 3; i++)
	{
		cbtVector3 vec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
		vec[i] = cbtScalar(1.);
		cbtVector3 tmp = localGetSupportingVertex(vec);
		m_localAabbMax[i] = tmp[i];
		vec[i] = cbtScalar(-1.);
		tmp = localGetSupportingVertex(vec);
		m_localAabbMin[i] = tmp[i];
	}
#endif
}